

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

char * __thiscall Fl_Input_::expand(Fl_Input_ *this,char *p,char *buf)

{
  byte bVar1;
  int iVar2;
  Fl_Boxtype t;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  byte *pbVar6;
  bool bVar7;
  double dVar8;
  int local_50;
  int c;
  int word_wrap;
  int word_count;
  int width_to_lastspace;
  char *lastspace_out;
  char *lastspace;
  char *e;
  char *o;
  char *buf_local;
  char *p_local;
  Fl_Input_ *this_local;
  
  pcVar4 = buf + 0x3fc;
  word_wrap = 0;
  c = 0;
  iVar2 = input_type(this);
  _word_count = buf;
  lastspace_out = p;
  e = buf;
  buf_local = p;
  if (iVar2 == 5) {
    while( true ) {
      bVar7 = false;
      if (e < pcVar4) {
        bVar7 = buf_local < this->value_ + this->size_;
      }
      if (!bVar7) break;
      iVar2 = fl_utf8len(*buf_local);
      if (0 < iVar2) {
        l_secret = fl_utf8encode(0x2a,e);
        e = e + l_secret;
      }
      buf_local = buf_local + 1;
    }
  }
  else {
    while (e < pcVar4) {
      iVar2 = wrap(this);
      if ((iVar2 != 0) &&
         ((this->value_ + this->size_ <= buf_local ||
          (iVar2 = isspace((uint)(byte)*buf_local), iVar2 != 0)))) {
        iVar2 = Fl_Widget::w(&this->super_Fl_Widget);
        t = Fl_Widget::box(&this->super_Fl_Widget);
        iVar3 = Fl::box_dw(t);
        dVar8 = fl_width(_word_count,(int)e - (int)_word_count);
        word_wrap = (int)dVar8 + word_wrap;
        if (lastspace_out + 1 < buf_local) {
          if ((c != 0) && ((iVar2 - iVar3) + -2 < word_wrap)) {
            buf_local = lastspace_out;
            e = _word_count;
            break;
          }
          c = c + 1;
        }
        lastspace_out = buf_local;
        _word_count = e;
      }
      if (this->value_ + this->size_ <= buf_local) break;
      pcVar5 = buf_local + 1;
      bVar1 = *buf_local;
      if ((bVar1 < 0x20) || (bVar1 == 0x7f)) {
        if ((bVar1 == 10) && (iVar2 = input_type(this), iVar2 == 4)) break;
        if ((bVar1 == 9) && (iVar2 = input_type(this), iVar2 == 4)) {
          local_50 = fl_utf_nb_char((uchar *)buf,(int)e - (int)buf);
          for (local_50 = local_50 % 8; buf_local = pcVar5, local_50 < 8 && e < pcVar4;
              local_50 = local_50 + 1) {
            *e = ' ';
            e = e + 1;
          }
        }
        else {
          pbVar6 = (byte *)(e + 1);
          *e = '^';
          e = e + 2;
          *pbVar6 = bVar1 ^ 0x40;
          buf_local = pcVar5;
        }
      }
      else {
        *e = bVar1;
        e = e + 1;
        buf_local = pcVar5;
      }
    }
  }
  *e = '\0';
  return buf_local;
}

Assistant:

const char* Fl_Input_::expand(const char* p, char* buf) const {
  char* o = buf;
  char* e = buf+(MAXBUF-4);
  const char* lastspace = p;
  char* lastspace_out = o;
  int width_to_lastspace = 0;
  int word_count = 0;
  int word_wrap;
//  const char *pe = p + strlen(p);

  if (input_type()==FL_SECRET_INPUT) {
    while (o<e && p < value_+size_) {
      if (fl_utf8len((char)p[0]) >= 1) {
	l_secret = fl_utf8encode(secret_char, o);
	o += l_secret;
      }
      p++;
    }

  } else while (o<e) {
    if (wrap() && (p >= value_+size_ || isspace(*p & 255))) {
      word_wrap = w() - Fl::box_dw(box()) - 2;
      width_to_lastspace += (int)fl_width(lastspace_out, (int) (o-lastspace_out));
      if (p > lastspace+1) {
	if (word_count && width_to_lastspace > word_wrap) {
	  p = lastspace; o = lastspace_out; break;
	}
	word_count++;
      }
      lastspace = p;
      lastspace_out = o;
    }

    if (p >= value_+size_) break;
    int c = *p++ & 255;
    if (c < ' ' || c == 127) {
      if (c=='\n' && input_type()==FL_MULTILINE_INPUT) {p--; break;}
      if (c == '\t' && input_type()==FL_MULTILINE_INPUT) {
        for (c = fl_utf_nb_char((uchar*)buf, (int) (o-buf))%8; c<8 && o<e; c++) {
          *o++ = ' ';
        }
      } else {
	*o++ = '^';
	*o++ = c ^ 0x40;
      }
    } else {
      *o++ = c;
    }
  }
  *o = 0;
  return p;
}